

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O2

bool __thiscall
ON_Brep::CollapseEdge(ON_Brep *this,int edge_index,bool bCloseTrimGap,int vertex_index)

{
  ON_BrepTrim *pOVar1;
  int iVar2;
  ON_BrepEdge *pOVar3;
  ON_BrepVertex *pOVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  size_t c;
  int *x;
  int iVar8;
  int i;
  ulong local_b8;
  ON_BrepEdge *local_b0;
  int local_a4;
  int local_a0;
  undefined4 local_9c;
  ulong local_98;
  ON_SimpleArray<int> ti;
  ON_SimpleArray<int> next_ti;
  ON_SimpleArray<int> prev_ti;
  ON_SimpleArray<int> li;
  
  local_9c = (undefined4)CONCAT71(in_register_00000011,bCloseTrimGap);
  pOVar3 = Edge(this,edge_index);
  if (pOVar3 != (ON_BrepEdge *)0x0) {
    iVar2 = pOVar3->m_vi[0];
    iVar8 = pOVar3->m_vi[1];
    if (vertex_index == -1) {
      vertex_index = iVar2;
    }
    pOVar4 = Vertex(this,vertex_index);
    if (pOVar4 != (ON_BrepVertex *)0x0) {
      c = (size_t)(pOVar3->m_ti).m_count;
      if (0 < (long)c) {
        local_b8 = CONCAT44(local_b8._4_4_,pOVar4->m_vertex_index);
        ON_SimpleArray<int>::ON_SimpleArray(&ti,c);
        ON_SimpleArray<int>::ON_SimpleArray(&li,c);
        ON_SimpleArray<int>::ON_SimpleArray(&prev_ti,c);
        local_b0 = pOVar3;
        local_a4 = iVar2;
        local_a0 = iVar8;
        ON_SimpleArray<int>::ON_SimpleArray(&next_ti,c);
        for (uVar7 = 0; pOVar3 = local_b0, c != uVar7; uVar7 = uVar7 + 1) {
          i = (local_b0->m_ti).m_a[uVar7];
          lVar6 = (long)i;
          if ((-1 < lVar6) &&
             (i < (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                  m_count)) {
            pOVar1 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                     m_a;
            if ((pOVar1[lVar6].m_trim_index != i) ||
               ((((pOVar1[lVar6].m_li < 0 ||
                  ((this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
                   m_count <= pOVar1[lVar6].m_li)) || (i = PrevTrim(this,i), i < 0)) ||
                (x = &pOVar1[lVar6].m_trim_index, i == *x)))) goto LAB_0043df34;
            ON_SimpleArray<int>::Append(&prev_ti,&i);
            i = NextTrim(this,*x);
            if ((i < 0) || (i == *x)) goto LAB_0043df34;
            ON_SimpleArray<int>::Append(&next_ti,&i);
            ON_SimpleArray<int>::Append(&ti,x);
            ON_SimpleArray<int>::Append(&li,&pOVar1[lVar6].m_li);
          }
        }
        iVar2 = (int)local_b8;
        ChangeVertex(this,local_b0->m_vi[0],(int)local_b8,true);
        ChangeVertex(this,pOVar3->m_vi[1],iVar2,true);
        uVar5 = 0;
        local_b8 = (ulong)(uint)ti.m_count;
        local_98 = uVar7;
        if (ti.m_count < 1) {
          local_b8 = uVar5;
        }
        for (; uVar7 = local_98, local_b8 != uVar5; uVar5 = uVar5 + 1) {
          i = ti.m_a[uVar5];
          pOVar1 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                   m_a;
          iVar2 = prev_ti.m_a[uVar5];
          iVar8 = next_ti.m_a[uVar5];
          DeleteTrim(this,pOVar1 + i,false);
          if ((char)local_9c != '\0') {
            CloseTrimGap(this,pOVar1 + iVar2,pOVar1 + iVar8);
          }
        }
LAB_0043df34:
        ON_SimpleArray<int>::~ON_SimpleArray(&next_ti);
        ON_SimpleArray<int>::~ON_SimpleArray(&prev_ti);
        ON_SimpleArray<int>::~ON_SimpleArray(&li);
        ON_SimpleArray<int>::~ON_SimpleArray(&ti);
        pOVar3 = local_b0;
        iVar2 = local_a4;
        iVar8 = local_a0;
        if (uVar7 < c) {
          return false;
        }
      }
      DeleteEdge(this,pOVar3,false);
      pOVar4 = Vertex(this,iVar2);
      if ((pOVar4 != (ON_BrepVertex *)0x0) && (iVar2 = ON_BrepVertex::EdgeCount(pOVar4), iVar2 == 0)
         ) {
        DeleteVertex(this,pOVar4);
      }
      pOVar4 = Vertex(this,iVar8);
      if (pOVar4 != (ON_BrepVertex *)0x0) {
        iVar2 = ON_BrepVertex::EdgeCount(pOVar4);
        if (iVar2 == 0) {
          DeleteVertex(this,pOVar4);
          return true;
        }
        return true;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_Brep::CollapseEdge( int edge_index, bool bCloseTrimGap, int vertex_index  )
{
  ON_BrepEdge* edge = Edge(edge_index);
  if ( 0 == edge )
    return false;
  edge_index = edge->m_edge_index; // clear high bit

  int orig_vid0 = edge->m_vi[0];
  int orig_vid1 = edge->m_vi[1];

  if ( -1 == vertex_index )
    vertex_index = edge->m_vi[0];
  ON_BrepVertex* vertex = Vertex(vertex_index);
  if ( 0 == vertex )
    return false;
  vertex_index = vertex->m_vertex_index; // clear high bit

  int trim_count = edge->m_ti.Count();
  if ( trim_count > 0 )
  {
    ON_SimpleArray<int> ti(trim_count);
    ON_SimpleArray<int> li(trim_count);
    ON_SimpleArray<int> prev_ti(trim_count);
    ON_SimpleArray<int> next_ti(trim_count);
    int i, eti;
    for ( eti = 0; eti < trim_count; eti++ )
    {
      i = edge->m_ti[eti];
      if ( i < 0 || i >= m_T.Count() )
        continue;
      const ON_BrepTrim& trim = m_T[i];
      if ( trim.m_trim_index != i )
        return false;
      if ( trim.m_li < 0 || trim.m_li >= m_L.Count() )
        return false;
      i = PrevTrim(trim.m_trim_index);
      if ( i < 0 || i == trim.m_trim_index )
        return false;
      prev_ti.Append(i);
      i = NextTrim(trim.m_trim_index);
      if ( i < 0 || i == trim.m_trim_index )
        return false;
      next_ti.Append(i);
      ti.Append(trim.m_trim_index);
      li.Append(trim.m_li);
    }

    ChangeVertex(edge->m_vi[0], vertex_index, true);
    ChangeVertex(edge->m_vi[1], vertex_index, true);
    
    trim_count = ti.Count();
    for ( eti = 0; eti < trim_count; eti++ )
    {
      i = ti[eti];
      ON_BrepTrim& trim = m_T[i];
      //ON_BrepLoop& loop = m_L[li[eti]];
      ON_BrepTrim& prev_trim = m_T[prev_ti[eti]];
      ON_BrepTrim& next_trim = m_T[next_ti[eti]];
      DeleteTrim(trim,false);
      if ( bCloseTrimGap )
        CloseTrimGap(prev_trim,next_trim);
    }
  }

  DeleteEdge(*edge,false);
  ON_BrepVertex* V0 = Vertex(orig_vid0);
  if (V0 && V0->EdgeCount() == 0)
    DeleteVertex(*V0);
  ON_BrepVertex* V1 = Vertex(orig_vid1);
  if (V1 && V1->EdgeCount() == 0)
    DeleteVertex(*V1);
  return true;
}